

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O0

uint64_t Assimp::strtoul10_64(char *in,char **out,uint *max_inout)

{
  bool bVar1;
  invalid_argument *this;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_d8;
  ulong local_b8;
  uint64_t new_value;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  uint64_t value;
  uint *puStack_28;
  uint cur;
  uint *max_inout_local;
  char **out_local;
  char *in_local;
  
  value._4_4_ = 0;
  local_38 = 0;
  puStack_28 = max_inout;
  max_inout_local = (uint *)out;
  out_local = (char **)in;
  if ((*in < '0') || ('9' < *in)) {
    new_value._3_1_ = 1;
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"The string \"",&local_99);
    std::operator+(&local_78,&local_98,(char *)out_local);
    std::operator+(&local_58,&local_78,"\" cannot be converted into a value.");
    std::invalid_argument::invalid_argument(this,(string *)&local_58);
    new_value._3_1_ = 0;
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  do {
    if ((*(char *)out_local < '0') || ('9' < *(char *)out_local)) {
      if (out != (char **)0x0) {
        *out = (char *)out_local;
      }
      if (max_inout != (uint *)0x0) {
        *max_inout = value._4_4_;
      }
      return local_38;
    }
    local_b8 = local_38 * 10 + (long)(*(char *)out_local + -0x30);
    if (local_b8 < local_38) {
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[24]>(&local_250,(char (*) [24])"Converting the string \"");
      this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_250,(char **)&out_local);
      this_02 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(this_01,(char (*) [37])"\" into a value resulted in overflow.");
      Formatter::basic_formatter::operator_cast_to_string(&local_d8,this_02);
      Logger::warn(this_00,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_250);
      return 0;
    }
    out_local = (char **)((long)out_local + 1);
    value._4_4_ = value._4_4_ + 1;
    local_38 = local_b8;
  } while ((max_inout == (uint *)0x0) || (*max_inout != value._4_4_));
  if (out != (char **)0x0) {
    while( true ) {
      bVar1 = false;
      if ('/' < *(char *)out_local) {
        bVar1 = *(char *)out_local < ':';
      }
      if (!bVar1) break;
      out_local = (char **)((long)out_local + 1);
    }
    *out = (char *)out_local;
  }
  return local_b8;
}

Assistant:

inline
uint64_t strtoul10_64( const char* in, const char** out=0, unsigned int* max_inout=0) {
    unsigned int cur = 0;
    uint64_t value = 0;

    if ( *in < '0' || *in > '9' ) {
        throw std::invalid_argument( std::string( "The string \"" ) + in + "\" cannot be converted into a value." );
    }

    for ( ;; ) {
        if ( *in < '0' || *in > '9' ) {
            break;
        }

        const uint64_t new_value = ( value * (uint64_t) 10 ) + ( (uint64_t) ( *in - '0' ) );

        // numeric overflow, we rely on you
        if ( new_value < value ) {
            ASSIMP_LOG_WARN_F( "Converting the string \"", in, "\" into a value resulted in overflow." );
            return 0;
        }

        value = new_value;

        ++in;
        ++cur;

        if (max_inout && *max_inout == cur) {
            if (out) { /* skip to end */
                while ( *in >= '0' && *in <= '9' ) {
                    ++in;
                }
                *out = in;
            }

            return value;
        }
    }
    if ( out ) {
        *out = in;
    }

    if ( max_inout ) {
        *max_inout = cur;
    }

    return value;
}